

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O2

bool __thiscall wasm::analysis::Flat<int>::join(Flat<int> *this,Element *joinee,Element *joiner)

{
  LatticeComparison LVar1;
  
  LVar1 = compare(this,joinee,joiner);
  switch(LVar1) {
  case NO_RELATION:
    *(__index_type *)
     ((long)&(joinee->
             super_variant<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>).
             super__Variant_base<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Move_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Copy_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Move_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Copy_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Variant_storage_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
     + 4) = '\x02';
    break;
  case EQUAL:
  case GREATER:
    return false;
  case LESS:
    *(__index_type *)
     ((long)&(joinee->
             super_variant<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>).
             super__Variant_base<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Move_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Copy_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Move_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Copy_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             .
             super__Variant_storage_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
     + 4) = *(__index_type *)
             ((long)&(joiner->
                     super_variant<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
                     ).
                     super__Variant_base<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
                     .
                     super__Move_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
                     .
                     super__Copy_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
                     .
                     super__Move_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
                     .
                     super__Copy_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
                     .
                     super__Variant_storage_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
             + 4);
    (joinee->super_variant<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>).
    super__Variant_base<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>.
    super__Move_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>.
    super__Copy_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>.
    super__Move_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>.
    super__Copy_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>.
    super__Variant_storage_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
    ._M_u = (joiner->
            super_variant<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>).
            super__Variant_base<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
            .
            super__Move_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
            .
            super__Copy_assign_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
            .
            super__Move_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
            .
            super__Copy_ctor_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
            .
            super__Variant_storage_alias<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top>
            ._M_u;
    break;
  default:
    ::wasm::handle_unreachable
              ("unexpected comparison result",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/flat.h"
               ,0x5b);
  }
  return true;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    switch (compare(joinee, joiner)) {
      case LESS:
        joinee = joiner;
        return true;
      case NO_RELATION:
        joinee = Element{Top{}};
        return true;
      case GREATER:
      case EQUAL:
        return false;
    }
    WASM_UNREACHABLE("unexpected comparison result");
  }